

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O1

void duckdb::HeapScatterListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  PhysicalType type;
  bool bVar1;
  Vector *this;
  idx_t iVar2;
  LogicalType *pLVar3;
  idx_t iVar4;
  ulong uVar5;
  idx_t iVar6;
  SelectionVector *pSVar7;
  idx_t iVar8;
  long lVar9;
  data_ptr_t pdVar10;
  uint64_t offset_00;
  long lVar11;
  uint64_t uVar12;
  long lVar13;
  byte *__s;
  long lVar14;
  data_ptr_t pdVar15;
  UnifiedVectorFormat list_vdata;
  UnifiedVectorFormat vdata;
  data_ptr_t list_entry_locations [2048];
  idx_t list_entry_sizes [2048];
  optional_ptr<duckdb::NestedValidity,_true> local_80f8;
  idx_t local_80f0;
  list_entry_t *local_80e8;
  SelectionVector *local_80e0;
  Vector *local_80d8;
  ulong local_80d0;
  UnifiedVectorFormat local_80c8;
  UnifiedVectorFormat local_8080;
  data_ptr_t local_8038 [2048];
  idx_t local_4038 [2049];
  
  local_80f8.ptr = parent_validity.ptr;
  local_80f0 = ser_count;
  local_80e0 = sel;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_8080);
  Vector::ToUnifiedFormat(v,vcount,&local_8080);
  local_80e8 = ListVector::GetData(v);
  this = ListVector::GetEntry(v);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_80c8);
  iVar2 = ListVector::GetListSize(v);
  Vector::ToUnifiedFormat(this,iVar2,&local_80c8);
  local_80d8 = v;
  pLVar3 = ListType::GetChildType(&v->type);
  if (local_80f0 != 0) {
    iVar2 = 0;
    type = pLVar3->physical_type_;
    do {
      iVar4 = iVar2;
      if (local_80e0->sel_vector != (sel_t *)0x0) {
        iVar4 = (idx_t)local_80e0->sel_vector[iVar2];
      }
      uVar5 = iVar4 + offset;
      if ((local_8080.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_8080.sel)->sel_vector[uVar5];
      }
      if ((local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
           >> (uVar5 & 0x3f) & 1) != 0)) {
        offset_00 = local_80e8[uVar5].offset;
        uVar12 = local_80e8[uVar5].length;
        *(uint64_t *)key_locations[iVar2] = uVar12;
        __s = key_locations[iVar2] + 8;
        key_locations[iVar2] = __s;
        uVar5 = uVar12 + 7 >> 3;
        switchD_00570541::default(__s,0xff,uVar5);
        key_locations[iVar2] = key_locations[iVar2] + uVar5;
        bVar1 = TypeIsConstantSize(type);
        if (bVar1) {
          pdVar15 = (data_ptr_t)0x0;
        }
        else {
          pdVar15 = key_locations[iVar2];
          key_locations[iVar2] = pdVar15 + uVar12 * 8;
        }
        if (uVar12 != 0) {
          lVar13 = 0;
          do {
            iVar4 = 0x800;
            if (uVar12 < 0x800) {
              iVar4 = uVar12;
            }
            lVar14 = iVar4 + (iVar4 == 0);
            iVar6 = offset_00;
            lVar11 = lVar14;
            do {
              iVar8 = iVar6;
              if ((local_80c8.sel)->sel_vector != (sel_t *)0x0) {
                iVar8 = (idx_t)(local_80c8.sel)->sel_vector[iVar6];
              }
              if ((local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                   (unsigned_long *)0x0) &&
                 ((local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0)) {
                *__s = *__s & ~(byte)(1L << ((byte)lVar13 & 0x3f));
              }
              lVar9 = lVar13 + 1;
              lVar13 = 0;
              if (lVar9 != 8) {
                lVar13 = lVar9;
              }
              __s = __s + (lVar9 == 8);
              iVar6 = iVar6 + 1;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            local_80d0 = uVar12;
            bVar1 = TypeIsConstantSize(type);
            if (bVar1) {
              iVar6 = GetTypeIdSize(type);
              pdVar10 = key_locations[iVar2];
              lVar11 = 0;
              do {
                local_8038[lVar11] = pdVar10;
                pdVar10 = pdVar10 + iVar6;
                lVar11 = lVar11 + 1;
              } while (lVar14 != lVar11);
              key_locations[iVar2] = pdVar10;
            }
            else {
              switchD_00570541::default(local_4038,0,iVar4 * 8);
              pSVar7 = FlatVector::IncrementalSelectionVector();
              RowOperations::ComputeEntrySizes(this,local_4038,iVar4,iVar4,pSVar7,offset_00);
              lVar11 = 0;
              do {
                pdVar10 = key_locations[iVar2];
                *(data_ptr_t *)((long)local_8038 + lVar11) = pdVar10;
                lVar9 = *(long *)((long)local_4038 + lVar11);
                key_locations[iVar2] = pdVar10 + lVar9;
                *(long *)(pdVar15 + lVar11) = lVar9;
                lVar11 = lVar11 + 8;
              } while (lVar14 * 8 != lVar11);
              pdVar15 = pdVar15 + lVar11;
            }
            iVar6 = ListVector::GetListSize(local_80d8);
            pSVar7 = FlatVector::IncrementalSelectionVector();
            RowOperations::HeapScatter
                      (this,iVar6,pSVar7,iVar4,local_8038,
                       (optional_ptr<duckdb::NestedValidity,_true>)0x0,offset_00);
            offset_00 = offset_00 + iVar4;
            uVar12 = local_80d0 - iVar4;
          } while (uVar12 != 0);
        }
      }
      else if (local_80f8.ptr != (NestedValidity *)0x0) {
        optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_80f8);
        NestedValidity::SetInvalid(local_80f8.ptr,iVar2);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != local_80f0);
  }
  if (local_80c8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80c8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8080.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HeapScatterListVector(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                  data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity,
                                  idx_t offset) {
	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);

	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);

	UnifiedVectorFormat list_vdata;
	child_vector.ToUnifiedFormat(ListVector::GetListSize(v), list_vdata);
	auto child_type = ListType::GetChildType(v.GetType()).InternalType();

	idx_t list_entry_sizes[STANDARD_VECTOR_SIZE];
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	for (idx_t i = 0; i < ser_count; i++) {
		auto idx = sel.get_index(i);
		auto source_idx = vdata.sel->get_index(idx + offset);
		if (!vdata.validity.RowIsValid(source_idx)) {
			if (parent_validity) {
				// set the row validitymask for this column to invalid
				parent_validity->SetInvalid(i);
			}
			continue;
		}
		auto list_entry = list_data[source_idx];

		// store list length
		Store<uint64_t>(list_entry.length, key_locations[i]);
		key_locations[i] += sizeof(list_entry.length);

		// make room for the validitymask
		data_ptr_t list_validitymask_location = key_locations[i];
		idx_t entry_offset_in_byte = 0;
		idx_t validitymask_size = (list_entry.length + 7) / 8;
		memset(list_validitymask_location, -1, validitymask_size);
		key_locations[i] += validitymask_size;

		// serialize size of each entry (if non-constant size)
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type)) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += list_entry.length * sizeof(idx_t);
		}

		auto entry_remaining = list_entry.length;
		auto entry_offset = list_entry.offset;
		while (entry_remaining > 0) {
			// the list entry can span multiple vectors
			auto next = MinValue((idx_t)STANDARD_VECTOR_SIZE, entry_remaining);

			// serialize list validity
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				auto list_idx = list_vdata.sel->get_index(entry_idx + entry_offset);
				if (!list_vdata.validity.RowIsValid(list_idx)) {
					*(list_validitymask_location) &= ~(1UL << entry_offset_in_byte);
				}
				if (++entry_offset_in_byte == 8) {
					list_validitymask_location++;
					entry_offset_in_byte = 0;
				}
			}

			if (TypeIsConstantSize(child_type)) {
				// constant size list entries: set list entry locations
				const idx_t type_size = GetTypeIdSize(child_type);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries: compute entry sizes and set list entry locations
				std::fill_n(list_entry_sizes, next, 0);
				RowOperations::ComputeEntrySizes(child_vector, list_entry_sizes, next, next,
				                                 *FlatVector::IncrementalSelectionVector(), entry_offset);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += list_entry_sizes[entry_idx];
					Store<idx_t>(list_entry_sizes[entry_idx], var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now serialize to the locations
			RowOperations::HeapScatter(child_vector, ListVector::GetListSize(v),
			                           *FlatVector::IncrementalSelectionVector(), next, list_entry_locations, nullptr,
			                           entry_offset);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}